

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Value_BlobFileValue::~Value_BlobFileValue(Value_BlobFileValue *this)

{
  Value_BlobFileValue *this_local;
  
  ~Value_BlobFileValue(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

Value_BlobFileValue::~Value_BlobFileValue() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.Value.BlobFileValue)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}